

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int send_finished(ptls_t *tls,ptls_buffer_t *sendbuf)

{
  st_ptls_traffic_protection_t *enc;
  size_t rec_start;
  uint8_t *puVar1;
  size_t sVar2;
  size_t sVar3;
  st_ptls_key_schedule_t *psVar4;
  int iVar5;
  size_t sVar6;
  uint8_t *puVar7;
  long lVar8;
  size_t sVar9;
  size_t sVar10;
  ptls_hash_context_t **pppVar11;
  
  rec_start = sendbuf->off;
  iVar5 = ptls_buffer_reserve(sendbuf,3);
  if (iVar5 == 0) {
    puVar1 = sendbuf->base;
    sVar2 = sendbuf->off;
    puVar7 = puVar1 + sVar2;
    puVar7[0] = '\x16';
    puVar7[1] = '\x03';
    puVar1[sVar2 + 2] = '\x03';
    sendbuf->off = sendbuf->off + 3;
    iVar5 = ptls_buffer_reserve(sendbuf,2);
    if (iVar5 == 0) {
      puVar7 = sendbuf->base;
      sVar2 = sendbuf->off;
      (puVar7 + sVar2)[0] = '\0';
      (puVar7 + sVar2)[1] = '\0';
      sVar3 = sendbuf->off;
      sVar2 = sVar3 + 2;
      sendbuf->off = sVar2;
      iVar5 = ptls_buffer_reserve(sendbuf,1);
      if (iVar5 == 0) {
        sendbuf->base[sendbuf->off] = '\x14';
        sendbuf->off = sendbuf->off + 1;
        iVar5 = ptls_buffer_reserve(sendbuf,3);
        if (iVar5 == 0) {
          puVar7 = sendbuf->base;
          sVar9 = sendbuf->off;
          puVar7[sVar9 + 2] = '\0';
          puVar7 = puVar7 + sVar9;
          puVar7[0] = '\0';
          puVar7[1] = '\0';
          sVar10 = sendbuf->off;
          sVar9 = sVar10 + 3;
          sendbuf->off = sVar9;
          iVar5 = ptls_buffer_reserve(sendbuf,(tls->key_schedule->hashes[0].algo)->digest_size);
          if (iVar5 == 0) {
            enc = &(tls->traffic_protection).enc;
            iVar5 = calc_verify_data(sendbuf->base + sendbuf->off,tls->key_schedule,enc);
            if (iVar5 == 0) {
              sVar6 = sendbuf->off + (tls->key_schedule->hashes[0].algo)->digest_size;
              sendbuf->off = sVar6;
              lVar8 = 0x10;
              do {
                sendbuf->base[sVar10] = (uint8_t)(sVar6 - sVar9 >> ((byte)lVar8 & 0x3f));
                lVar8 = lVar8 + -8;
                sVar10 = sVar10 + 1;
              } while (lVar8 != -8);
              psVar4 = tls->key_schedule;
              puVar7 = sendbuf->base;
              sVar9 = sendbuf->off;
              if ((psVar4 != (st_ptls_key_schedule_t *)0x0) && (psVar4->num_hashes != 0)) {
                pppVar11 = &psVar4->hashes[0].ctx;
                sVar10 = 0;
                do {
                  (*(*pppVar11)->update)(*pppVar11,puVar7 + sVar2,sVar9 - sVar2);
                  sVar10 = sVar10 + 1;
                  pppVar11 = pppVar11 + 2;
                } while (sVar10 != psVar4->num_hashes);
                puVar7 = sendbuf->base;
                sVar9 = sendbuf->off;
              }
              puVar7[sVar3] = (uint8_t)(sVar9 - sVar2 >> 8);
              sendbuf->base[sVar3 + 1] = (uint8_t)(sVar9 - sVar2);
              iVar5 = buffer_encrypt_record(sendbuf,rec_start,enc);
              return iVar5;
            }
          }
        }
      }
    }
  }
  return iVar5;
}

Assistant:

static int send_finished(ptls_t *tls, ptls_buffer_t *sendbuf)
{
    int ret;

    buffer_push_handshake(sendbuf, tls->key_schedule, &tls->traffic_protection.enc, PTLS_HANDSHAKE_TYPE_FINISHED, {
        if ((ret = ptls_buffer_reserve(sendbuf, tls->key_schedule->hashes[0].algo->digest_size)) != 0)
            goto Exit;
        if ((ret = calc_verify_data(sendbuf->base + sendbuf->off, tls->key_schedule, tls->traffic_protection.enc.secret)) != 0)
            goto Exit;
        sendbuf->off += tls->key_schedule->hashes[0].algo->digest_size;
    });

Exit:
    return ret;
}